

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprPointerLiteral * AllocateTypeStorage(ExpressionEvalContext *ctx,SynBase *source,TypeBase *type)

{
  SmallArray<ExprPointerLiteral_*,_32U> *this;
  ExprPointerLiteral *pEVar1;
  long lVar2;
  ExprPointerLiteral *pEVar3;
  Allocator *pAVar4;
  int iVar5;
  ExprPointerLiteral **ppEVar6;
  TypeRef *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint index;
  char *msg;
  uchar *ptr;
  
  if ((type == (TypeBase *)0x0) || (type->typeID != 0)) {
    this = &ctx->abandonedMemory;
    for (index = 0; index < (ctx->abandonedMemory).count; index = index + 1) {
      ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::operator[](this,index);
      pEVar1 = *ppEVar6;
      if ((long)pEVar1->end - (long)pEVar1->ptr == type->size) {
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
        (pEVar1->super_ExprBase).type = &pTVar7->super_TypeBase;
        memset(pEVar1->ptr,0,(ulong)(uint)type->size);
        ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::back(this);
        pEVar3 = *ppEVar6;
        ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::operator[](this,index);
        *ppEVar6 = pEVar3;
        SmallArray<ExprPointerLiteral_*,_32U>::pop_back(this);
        return pEVar1;
      }
    }
    lVar2 = type->size;
    if ((long)(ulong)ctx->variableMemoryLimit < lVar2) {
      msg = "ERROR: single variable memory limit";
    }
    else {
      if ((long)(lVar2 + (ulong)ctx->totalMemory) <= (long)(ulong)ctx->totalMemoryLimit) {
        ctx->totalMemory = ctx->totalMemory + (int)lVar2;
        iVar5 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
        ptr = (uchar *)CONCAT44(extraout_var,iVar5);
        memset(ptr,0,(ulong)(uint)type->size);
        pAVar4 = ctx->ctx->allocator;
        iVar5 = (*pAVar4->_vptr_Allocator[2])(pAVar4,0x40);
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
        ExprPointerLiteral::ExprPointerLiteral
                  ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5),source,
                   &pTVar7->super_TypeBase,ptr,ptr + type->size);
        return (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5);
      }
      msg = "ERROR: total variable memory limit";
    }
    Report(ctx,msg);
  }
  return (ExprPointerLiteral *)0x0;
}

Assistant:

ExprPointerLiteral* AllocateTypeStorage(ExpressionEvalContext &ctx, SynBase *source, TypeBase *type)
{
	if(isType<TypeError>(type))
		return NULL;

	for(unsigned i = 0; i < ctx.abandonedMemory.size(); i++)
	{
		ExprPointerLiteral *ptr = ctx.abandonedMemory[i];

		if(ptr->end - ptr->ptr == type->size)
		{
			ptr->type = ctx.ctx.GetReferenceType(type);

			memset(ptr->ptr, 0, unsigned(type->size));

			ctx.abandonedMemory[i] = ctx.abandonedMemory.back();
			ctx.abandonedMemory.pop_back();

			return ptr;
		}
	}

	if(type->size > ctx.variableMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: single variable memory limit");

	if(ctx.totalMemory + type->size > ctx.totalMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: total variable memory limit");

	ctx.totalMemory += unsigned(type->size);

	unsigned char *memory = (unsigned char*)ctx.ctx.allocator->alloc(unsigned(type->size));

	memset(memory, 0, unsigned(type->size));

	return new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(source, ctx.ctx.GetReferenceType(type), memory, memory + type->size);
}